

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrintVisitor.cpp
# Opt level: O0

void __thiscall IRT::PrintVisitor::AddArrow(PrintVisitor *this,int child_id)

{
  __cxx11 local_e8 [48];
  __cxx11 local_b8 [32];
  string local_98 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38 [36];
  int local_14;
  PrintVisitor *pPStack_10;
  int child_id_local;
  PrintVisitor *this_local;
  
  local_14 = child_id;
  pPStack_10 = this;
  std::__cxx11::to_string(local_b8,this->lastVisited + 1);
  std::operator+((char *)local_98,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"\t");
  std::operator+(local_78,(char *)local_98);
  std::__cxx11::to_string(local_e8,local_14);
  std::operator+(local_58,local_78);
  std::operator+(local_38,(char *)local_58);
  std::__cxx11::string::operator+=((string *)&this->description,(string *)local_38);
  std::__cxx11::string::~string((string *)local_38);
  std::__cxx11::string::~string((string *)local_58);
  std::__cxx11::string::~string((string *)local_e8);
  std::__cxx11::string::~string((string *)local_78);
  std::__cxx11::string::~string(local_98);
  std::__cxx11::string::~string((string *)local_b8);
  return;
}

Assistant:

void IRT::PrintVisitor::AddArrow( int child_id ) {
    this->description += "\t" + std::to_string( lastVisited + 1 ) + " -> " + std::to_string( child_id ) + "\n";
}